

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Mix_1in_8out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  
  if (toMix != 0) {
    fVar2 = *coefficients;
    fVar3 = coefficients[1];
    fVar4 = coefficients[2];
    fVar5 = coefficients[3];
    fVar6 = coefficients[4];
    fVar7 = coefficients[5];
    fVar8 = coefficients[6];
    fVar9 = coefficients[7];
    lVar10 = 0;
    do {
      fVar1 = src[lVar10];
      *dst = *dst + fVar1 * fVar2;
      dst[1] = dst[1] + fVar1 * fVar3;
      dst[2] = dst[2] + fVar1 * fVar4;
      dst[3] = dst[3] + fVar1 * fVar5;
      dst[4] = fVar1 * fVar6 + dst[4];
      dst[5] = fVar1 * fVar7 + dst[5];
      dst[6] = fVar1 * fVar8 + dst[6];
      dst[7] = fVar1 * fVar9 + dst[7];
      dst = dst + 8;
      lVar10 = lVar10 + 1;
    } while (toMix != (uint32_t)lVar10);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_8out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 1, dst += 8)
	{
		dst[0] += src[0] * coefficients[0];
		dst[1] += src[0] * coefficients[1];
		dst[2] += src[0] * coefficients[2];
		dst[3] += src[0] * coefficients[3];
		dst[4] += src[0] * coefficients[4];
		dst[5] += src[0] * coefficients[5];
		dst[6] += src[0] * coefficients[6];
		dst[7] += src[0] * coefficients[7];
	}
}